

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_format.cpp
# Opt level: O0

ON_String ON_String::FormatToString(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined1 local_58 [8];
  va_list args;
  undefined1 local_38 [8];
  ON_StringBuffer buffer;
  char *format_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  buffer.m_heap_buffer_capacity = in_RSI;
  ON_StringBuffer::ON_StringBuffer((ON_StringBuffer *)local_38);
  args[0].overflow_arg_area = local_118;
  args[0]._0_8_ = &stack0x00000008;
  local_58._4_4_ = 0x30;
  local_58._0_4_ = 0x10;
  FormatVargsIntoBuffer
            ((ON_StringBuffer *)local_38,(char *)buffer.m_heap_buffer_capacity,
             (__va_list_tag *)local_58);
  ON_String((ON_String *)format,(char *)local_38);
  ON_StringBuffer::~ON_StringBuffer((ON_StringBuffer *)local_38);
  return (ON_String)format;
}

Assistant:

const ON_String ON_VARGS_FUNC_CDECL ON_String::FormatToString(
  const char* format,
  ...
  )
{
  ON_StringBuffer buffer;
  va_list args;
  va_start(args, format);
  ON_String::FormatVargsIntoBuffer(buffer, format, args);
  va_end(args);
  return ON_String(buffer.m_buffer);
}